

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

void __thiscall
MemoryLeakDetector::storeLeakInformation
          (MemoryLeakDetector *this,MemoryLeakDetectorNode *node,char *new_memory,size_t size,
          TestMemoryAllocator *allocator,char *file,size_t line)

{
  MemoryLeakDetectorNode MVar1;
  MemLeakPeriod MVar2;
  uint uVar3;
  
  uVar3 = this->allocationSequenceNumber_;
  this->allocationSequenceNumber_ = uVar3 + 1;
  MVar2 = this->current_period_;
  MVar1 = (MemoryLeakDetectorNode)this->current_allocation_stage_;
  *(uint *)(node + 8) = uVar3;
  *(char **)(node + 0x10) = new_memory;
  *(size_t *)node = size;
  *(TestMemoryAllocator **)(node + 0x28) = allocator;
  *(MemLeakPeriod *)(node + 0x30) = MVar2;
  node[0x34] = MVar1;
  *(char **)(node + 0x18) = file;
  *(size_t *)(node + 0x20) = line;
  new_memory[size + 2] = 'S';
  (new_memory + size)[0] = 'B';
  (new_memory + size)[1] = 'A';
  uVar3 = (int)*(ulong *)(node + 0x10) + (int)(*(ulong *)(node + 0x10) / 0x49) * -0x49;
  *(MemoryLeakDetectorNode **)(node + 0x38) = (this->memoryTable_).table_[uVar3].head_;
  (this->memoryTable_).table_[uVar3].head_ = node;
  return;
}

Assistant:

void MemoryLeakDetector::storeLeakInformation(MemoryLeakDetectorNode * node, char *new_memory, size_t size, TestMemoryAllocator *allocator, const char *file, size_t line)
{
    node->init(new_memory, allocationSequenceNumber_++, size, allocator, current_period_, current_allocation_stage_, file, line);
    addMemoryCorruptionInformation(node->memory_ + node->size_);
    memoryTable_.addNewNode(node);
}